

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat.cpp
# Opt level: O1

mat4f * inverse(mat4f a)

{
  mat4f *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  undefined8 in_stack_00000024;
  float in_stack_0000002c;
  float in_stack_00000030;
  float in_stack_00000034;
  float in_stack_00000038;
  float in_stack_0000003c;
  float in_stack_00000040;
  float in_stack_00000044;
  
  *(float *)((long)(in_RDI->data + 3) + 0) = 0.0;
  *(float *)((long)(in_RDI->data + 3) + 4) = 0.0;
  *(float *)((long)(in_RDI->data + 3) + 8) = 0.0;
  *(float *)((long)(in_RDI->data + 3) + 0xc) = 0.0;
  *(float *)((long)(in_RDI->data + 2) + 0) = 0.0;
  *(float *)((long)(in_RDI->data + 2) + 4) = 0.0;
  *(float *)((long)(in_RDI->data + 2) + 8) = 0.0;
  *(float *)((long)(in_RDI->data + 2) + 0xc) = 0.0;
  *(float *)((long)(in_RDI->data + 1) + 0) = 0.0;
  *(float *)((long)(in_RDI->data + 1) + 4) = 0.0;
  *(float *)((long)(in_RDI->data + 1) + 8) = 0.0;
  *(float *)((long)(in_RDI->data + 1) + 0xc) = 0.0;
  *(float *)((long)(in_RDI->data + 0) + 0) = 0.0;
  *(float *)((long)(in_RDI->data + 0) + 4) = 0.0;
  *(float *)((long)(in_RDI->data + 0) + 8) = 0.0;
  *(float *)((long)(in_RDI->data + 0) + 0xc) = 0.0;
  fVar1 = -in_stack_0000001c;
  fVar4 = -in_stack_0000000c;
  fVar14 = (float)in_stack_00000024;
  fVar15 = (float)((ulong)in_stack_00000024 >> 0x20);
  fVar2 = -in_stack_0000002c;
  fVar11 = -in_stack_0000003c;
  fVar12 = fVar11 * fVar14 * in_stack_00000030 +
           in_stack_0000003c * in_stack_00000020 * in_stack_00000034 +
           fVar14 * in_stack_0000002c * in_stack_00000040 +
           fVar2 * in_stack_00000020 * in_stack_00000044 +
           in_stack_00000030 * in_stack_0000001c * in_stack_00000044 +
           fVar1 * in_stack_00000034 * in_stack_00000040;
  fVar13 = -in_stack_00000018;
  fVar7 = -in_stack_00000038;
  fVar9 = -fVar15;
  fVar6 = -in_stack_00000008;
  fVar5 = in_stack_00000038 * fVar14 * in_stack_00000030 +
          fVar7 * in_stack_00000020 * in_stack_00000034 +
          fVar9 * fVar14 * in_stack_00000040 +
          fVar15 * in_stack_00000020 * in_stack_00000044 +
          fVar13 * in_stack_00000030 * in_stack_00000044 +
          in_stack_00000040 * in_stack_00000018 * in_stack_00000034;
  fVar10 = fVar14 * fVar7 * in_stack_0000002c +
           in_stack_00000034 * in_stack_00000038 * in_stack_0000001c +
           fVar14 * fVar15 * in_stack_0000003c +
           in_stack_00000044 * fVar9 * in_stack_0000001c +
           in_stack_00000018 * in_stack_0000002c * in_stack_00000044 +
           in_stack_00000034 * fVar13 * in_stack_0000003c;
  fVar8 = in_stack_00000020 * in_stack_00000038 * in_stack_0000002c +
          in_stack_0000001c * fVar7 * in_stack_00000030 +
          fVar9 * in_stack_00000020 * in_stack_0000003c +
          fVar15 * in_stack_0000001c * in_stack_00000040 +
          in_stack_0000002c * fVar13 * in_stack_00000040 +
          in_stack_00000030 * in_stack_00000018 * in_stack_0000003c;
  fVar3 = 1.0 / (in_stack_00000014 * fVar8 +
                in_stack_00000010 * fVar10 + in_stack_00000008 * fVar12 + in_stack_0000000c * fVar5)
  ;
  in_RDI->data[0][0] = fVar12 * fVar3;
  in_RDI->data[0][1] =
       (in_stack_00000014 * in_stack_0000003c * in_stack_00000030 +
       fVar11 * in_stack_00000010 * in_stack_00000034 +
       fVar2 * in_stack_00000014 * in_stack_00000040 +
       in_stack_00000010 * in_stack_0000002c * in_stack_00000044 +
       fVar4 * in_stack_00000030 * in_stack_00000044 +
       in_stack_0000000c * in_stack_00000034 * in_stack_00000040) * fVar3;
  in_RDI->data[0][2] =
       (fVar11 * in_stack_00000014 * in_stack_00000020 +
       in_stack_0000003c * in_stack_00000010 * fVar14 +
       in_stack_00000014 * in_stack_0000001c * in_stack_00000040 +
       fVar1 * in_stack_00000010 * in_stack_00000044 +
       in_stack_00000020 * in_stack_0000000c * in_stack_00000044 +
       fVar4 * fVar14 * in_stack_00000040) * fVar3;
  in_RDI->data[0][3] =
       (in_stack_00000014 * in_stack_0000002c * in_stack_00000020 +
       fVar2 * in_stack_00000010 * fVar14 +
       fVar1 * in_stack_00000014 * in_stack_00000030 +
       in_stack_00000010 * in_stack_0000001c * in_stack_00000034 +
       fVar4 * in_stack_00000020 * in_stack_00000034 +
       in_stack_0000000c * fVar14 * in_stack_00000030) * fVar3;
  in_RDI->data[1][0] = fVar5 * fVar3;
  in_RDI->data[1][1] =
       (fVar7 * in_stack_00000014 * in_stack_00000030 +
       in_stack_00000038 * in_stack_00000010 * in_stack_00000034 +
       fVar15 * in_stack_00000014 * in_stack_00000040 +
       fVar9 * in_stack_00000010 * in_stack_00000044 +
       in_stack_00000008 * in_stack_00000030 * in_stack_00000044 +
       in_stack_00000040 * fVar6 * in_stack_00000034) * fVar3;
  in_RDI->data[1][2] =
       (in_stack_00000038 * in_stack_00000014 * in_stack_00000020 +
       fVar7 * in_stack_00000010 * fVar14 +
       fVar13 * in_stack_00000014 * in_stack_00000040 +
       in_stack_00000010 * in_stack_00000018 * in_stack_00000044 +
       fVar6 * in_stack_00000020 * in_stack_00000044 +
       in_stack_00000040 * in_stack_00000008 * fVar14) * fVar3;
  in_RDI->data[1][3] =
       (fVar9 * in_stack_00000014 * in_stack_00000020 +
       fVar15 * in_stack_00000010 * fVar14 +
       in_stack_00000018 * in_stack_00000014 * in_stack_00000030 +
       fVar13 * in_stack_00000010 * in_stack_00000034 +
       in_stack_00000008 * in_stack_00000020 * in_stack_00000034 +
       in_stack_00000030 * fVar6 * fVar14) * fVar3;
  in_RDI->data[2][0] = fVar10 * fVar3;
  in_RDI->data[2][1] =
       (in_stack_00000038 * in_stack_00000014 * in_stack_0000002c +
       in_stack_00000034 * fVar7 * in_stack_0000000c +
       fVar9 * in_stack_00000014 * in_stack_0000003c +
       in_stack_00000044 * fVar15 * in_stack_0000000c +
       fVar6 * in_stack_0000002c * in_stack_00000044 +
       in_stack_00000034 * in_stack_00000008 * in_stack_0000003c) * fVar3;
  in_RDI->data[2][2] =
       (fVar7 * in_stack_00000014 * in_stack_0000001c +
       fVar14 * in_stack_00000038 * in_stack_0000000c +
       in_stack_00000018 * in_stack_00000014 * in_stack_0000003c +
       in_stack_00000044 * fVar13 * in_stack_0000000c +
       in_stack_00000008 * in_stack_0000001c * in_stack_00000044 +
       fVar6 * fVar14 * in_stack_0000003c) * fVar3;
  in_RDI->data[2][3] =
       (fVar15 * in_stack_00000014 * in_stack_0000001c +
       fVar14 * fVar9 * in_stack_0000000c +
       fVar13 * in_stack_00000014 * in_stack_0000002c +
       in_stack_00000034 * in_stack_00000018 * in_stack_0000000c +
       fVar6 * in_stack_0000001c * in_stack_00000034 +
       in_stack_00000008 * fVar14 * in_stack_0000002c) * fVar3;
  in_RDI->data[3][0] = fVar3 * fVar8;
  in_RDI->data[3][1] =
       fVar3 * (fVar7 * in_stack_00000010 * in_stack_0000002c +
               in_stack_00000038 * in_stack_0000000c * in_stack_00000030 +
               fVar15 * in_stack_00000010 * in_stack_0000003c +
               fVar9 * in_stack_0000000c * in_stack_00000040 +
               in_stack_0000002c * in_stack_00000008 * in_stack_00000040 +
               in_stack_00000030 * fVar6 * in_stack_0000003c);
  in_RDI->data[3][2] =
       fVar3 * (in_stack_00000038 * in_stack_00000010 * in_stack_0000001c +
               fVar7 * in_stack_0000000c * in_stack_00000020 +
               fVar13 * in_stack_00000010 * in_stack_0000003c +
               in_stack_00000018 * in_stack_0000000c * in_stack_00000040 +
               fVar6 * in_stack_0000001c * in_stack_00000040 +
               in_stack_00000008 * in_stack_00000020 * in_stack_0000003c);
  in_RDI->data[3][3] =
       fVar3 * (fVar9 * in_stack_00000010 * in_stack_0000001c +
               fVar15 * in_stack_0000000c * in_stack_00000020 +
               in_stack_00000010 * in_stack_00000018 * in_stack_0000002c +
               fVar13 * in_stack_0000000c * in_stack_00000030 +
               in_stack_00000008 * in_stack_0000001c * in_stack_00000030 +
               fVar6 * in_stack_00000020 * in_stack_0000002c);
  return in_RDI;
}

Assistant:

mat4f inverse(mat4f a)
{
    // a,b should be either row-major or column-major
    assert(sizeof(a) == 16*sizeof(float));
    mat4f b;
    invert4x4(a[0], b[0]);
    return b;
}